

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

uint8_t * google::protobuf::internal::SerializeMapKeyWithCachedSizes
                    (FieldDescriptor *field,MapKey *value,uint8_t *target,
                    EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  int32_t iVar3;
  uint uVar4;
  uint32_t uVar5;
  uint64_t uVar6;
  size_t __n;
  int64_t iVar7;
  ulong uVar8;
  uint8_t *puVar9;
  ulong uVar10;
  byte *pbVar11;
  string_view s;
  LogMessageFatal local_30 [16];
  
  if (stream->end_ <= target) {
    target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  switch(field->type_) {
  case '\x01':
  case '\x02':
  case '\n':
  case '\v':
  case '\f':
  case '\x0e':
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/wire_format.cc"
               ,0x442);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)local_30,(char (*) [12])"Unsupported");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
  case '\x03':
    uVar8 = MapKey::GetInt64Value(value);
    *target = 8;
    pbVar11 = target + 1;
    uVar10 = uVar8;
    if (uVar8 < 0x80) {
LAB_00329819:
      pbVar11 = target + 1;
    }
    else {
      do {
        *pbVar11 = (byte)uVar10 | 0x80;
        uVar8 = uVar10 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar1 = 0x3fff < uVar10;
        uVar10 = uVar8;
      } while (bVar1);
    }
    goto LAB_0032981c;
  case '\x04':
    uVar8 = MapKey::GetUInt64Value(value);
    *target = 8;
    pbVar11 = target + 1;
    uVar6 = uVar8;
    if (uVar8 < 0x80) goto LAB_00329819;
    do {
      *pbVar11 = (byte)uVar6 | 0x80;
      uVar8 = uVar6 >> 7;
      pbVar11 = pbVar11 + 1;
      bVar1 = 0x3fff < uVar6;
      uVar6 = uVar8;
    } while (bVar1);
    goto LAB_0032981c;
  case '\x05':
    uVar2 = MapKey::GetInt32Value(value);
    *target = 8;
    pbVar11 = target + 1;
    uVar8 = (ulong)(int)uVar2;
    uVar10 = uVar8;
    if (0x7f < uVar2) {
      do {
        *pbVar11 = (byte)uVar10 | 0x80;
        uVar8 = uVar10 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar1 = 0x3fff < uVar10;
        uVar10 = uVar8;
      } while (bVar1);
    }
    *pbVar11 = (byte)uVar8;
    goto LAB_0032981e;
  case '\x06':
    uVar6 = MapKey::GetUInt64Value(value);
    goto LAB_0032978b;
  case '\a':
    uVar5 = MapKey::GetUInt32Value(value);
    goto LAB_003297e8;
  case '\b':
    bVar1 = MapKey::GetBoolValue(value);
    *target = 8;
    target[1] = bVar1;
    target = target + 2;
    break;
  case '\t':
    s = MapKey::GetStringValue(value);
    __n = s._M_len;
    if ((0x7f < (long)__n) || ((long)(stream->end_ + (0xe - (long)target)) < (long)__n)) {
      puVar9 = io::EpsCopyOutputStream::WriteStringOutline(stream,1,s,target);
      return puVar9;
    }
    *target = 10;
    target[1] = (byte)s._M_len;
    memcpy(target + 2,s._M_str,__n);
    target = target + __n + 2;
    break;
  case '\r':
    uVar4 = MapKey::GetUInt32Value(value);
    *target = 8;
    pbVar11 = target + 1;
    uVar5 = uVar4;
    if (0x7f < uVar4) {
      do {
        *pbVar11 = (byte)uVar5 | 0x80;
        uVar4 = uVar5 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar1 = 0x3fff < uVar5;
        uVar5 = uVar4;
      } while (bVar1);
    }
    goto LAB_003297d2;
  case '\x0f':
    uVar5 = MapKey::GetInt32Value(value);
LAB_003297e8:
    *target = 0xd;
    *(uint32_t *)(target + 1) = uVar5;
    target = target + 5;
    break;
  case '\x10':
    uVar6 = MapKey::GetInt64Value(value);
LAB_0032978b:
    *target = 9;
    *(uint64_t *)(target + 1) = uVar6;
    target = target + 9;
    break;
  case '\x11':
    iVar3 = MapKey::GetInt32Value(value);
    *target = 8;
    pbVar11 = target + 1;
    uVar4 = iVar3 >> 0x1f ^ iVar3 * 2;
    uVar2 = uVar4;
    if (0x7f < uVar4) {
      do {
        *pbVar11 = (byte)uVar2 | 0x80;
        uVar4 = uVar2 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar1 = 0x3fff < uVar2;
        uVar2 = uVar4;
      } while (bVar1);
    }
LAB_003297d2:
    *pbVar11 = (byte)uVar4;
    goto LAB_0032981e;
  case '\x12':
    iVar7 = MapKey::GetInt64Value(value);
    *target = 8;
    pbVar11 = target + 1;
    uVar8 = iVar7 >> 0x3f ^ iVar7 * 2;
    uVar10 = uVar8;
    if (uVar8 < 0x80) goto LAB_00329819;
    do {
      *pbVar11 = (byte)uVar10 | 0x80;
      uVar8 = uVar10 >> 7;
      pbVar11 = pbVar11 + 1;
      bVar1 = 0x3fff < uVar10;
      uVar10 = uVar8;
    } while (bVar1);
LAB_0032981c:
    *pbVar11 = (byte)uVar8;
LAB_0032981e:
    target = pbVar11 + 1;
  }
  return target;
}

Assistant:

uint8_t* SerializeMapKeyWithCachedSizes(const FieldDescriptor* field,
                                        const MapKey& value, uint8_t* target,
                                        io::EpsCopyOutputStream* stream) {
  target = stream->EnsureSpace(target);
  switch (field->type()) {
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_BYTES:
    case FieldDescriptor::TYPE_ENUM:
      ABSL_LOG(FATAL) << "Unsupported";
      break;
#define CASE_TYPE(FieldType, CamelFieldType, CamelCppType)   \
  case FieldDescriptor::TYPE_##FieldType:                    \
    target = WireFormatLite::Write##CamelFieldType##ToArray( \
        1, value.Get##CamelCppType##Value(), target);        \
    break;
      CASE_TYPE(INT64, Int64, Int64)
      CASE_TYPE(UINT64, UInt64, UInt64)
      CASE_TYPE(INT32, Int32, Int32)
      CASE_TYPE(FIXED64, Fixed64, UInt64)
      CASE_TYPE(FIXED32, Fixed32, UInt32)
      CASE_TYPE(BOOL, Bool, Bool)
      CASE_TYPE(UINT32, UInt32, UInt32)
      CASE_TYPE(SFIXED32, SFixed32, Int32)
      CASE_TYPE(SFIXED64, SFixed64, Int64)
      CASE_TYPE(SINT32, SInt32, Int32)
      CASE_TYPE(SINT64, SInt64, Int64)
#undef CASE_TYPE
    case FieldDescriptor::TYPE_STRING:
      target = stream->WriteString(1, value.GetStringValue(), target);
      break;
  }
  return target;
}